

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O2

void __thiscall ki::protocol::dml::MessageManager::~MessageManager(MessageManager *this)

{
  MessageModule *this_00;
  pointer ppMVar1;
  pointer ppMVar2;
  
  for (ppMVar2 = (this->m_modules).
                 super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar2 !=
      (this->m_modules).
      super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar2 = ppMVar2 + 1) {
    this_00 = *ppMVar2;
    if (this_00 != (MessageModule *)0x0) {
      MessageModule::~MessageModule(this_00);
    }
    operator_delete(this_00);
  }
  ppMVar1 = (this->m_modules).
            super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar2 != ppMVar1) {
    (this->m_modules).
    super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppMVar1;
  }
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>,_std::_Select1st<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
  ::clear(&(this->m_service_id_map)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
  ::clear(&(this->m_protocol_type_map)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
  ::~_Rb_tree(&(this->m_protocol_type_map)._M_t);
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>,_std::_Select1st<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
  ::~_Rb_tree(&(this->m_service_id_map)._M_t);
  std::
  _Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
  ::~_Vector_base((_Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
                   *)this);
  return;
}

Assistant:

MessageManager::~MessageManager()
	{
		for (auto it = m_modules.begin();
			it != m_modules.end(); ++it)
			delete *it;
		m_modules.clear();
		m_service_id_map.clear();
		m_protocol_type_map.clear();
	}